

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_test.c
# Opt level: O1

bool_t mtTest(void)

{
  bool_t bVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  size_t ctr [1];
  mt_mtx_t mtx [1];
  size_t local_40;
  mt_mtx_t local_38;
  
  local_40 = 0;
  bVar1 = mtMtxCreate(&local_38);
  if (bVar1 == 0) {
    uVar4 = 0;
  }
  else {
    mtMtxLock(&local_38);
    mtMtxUnlock(&local_38);
    mtMtxClose(&local_38);
    mtAtomicIncr(&local_40);
    mtAtomicIncr(&local_40);
    mtAtomicDecr(&local_40);
    uVar3 = 0;
    sVar2 = mtAtomicCmpSwap(&local_40,1,0);
    uVar4 = 0;
    if ((sVar2 == 1) && (uVar4 = uVar3, local_40 == 0)) {
      bVar1 = mtCallOnce(&_once,init);
      if ((bVar1 != 0) && ((_inited & 1) != 0)) {
        bVar1 = mtCallOnce(&_once,init);
        uVar4 = (uint)(bVar1 != 0 & _inited);
      }
    }
  }
  return uVar4;
}

Assistant:

bool_t mtTest()
{
	mt_mtx_t mtx[1];
	size_t ctr[1] = { SIZE_0 };
	// мьютексы
	if (!mtMtxCreate(mtx))
		return FALSE;
	mtMtxLock(mtx);
	mtMtxUnlock(mtx);
	mtMtxClose(mtx);
	// атомарные операции
	mtAtomicIncr(ctr);
	mtAtomicIncr(ctr);
	mtAtomicDecr(ctr);
	if (mtAtomicCmpSwap(ctr, 1, 0) != 1 || *ctr != SIZE_0)
		return FALSE;
	// однократный вызов
	if (!mtCallOnce(&_once, init) || !_inited)
		return FALSE;
	if (!mtCallOnce(&_once, init) || !_inited)
		return FALSE;
	// все нормально
	return TRUE;
}